

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

int nni_msg_insert(nni_msg *m,void *data,size_t len)

{
  size_t *psVar1;
  uint8_t *puVar2;
  size_t __n;
  int iVar3;
  uint8_t *puVar4;
  ulong uVar5;
  
  if ((m->m_body).ch_ptr == (uint8_t *)0x0) {
    (m->m_body).ch_ptr = (m->m_body).ch_buf;
  }
  puVar2 = (m->m_body).ch_buf;
  puVar4 = (m->m_body).ch_ptr;
  if ((puVar4 < puVar2) || (uVar5 = (m->m_body).ch_cap, puVar2 + uVar5 <= puVar4)) {
LAB_001130c4:
    iVar3 = nni_chunk_grow(&m->m_body,0,len);
    if (iVar3 != 0) {
      return iVar3;
    }
    puVar4 = (m->m_body).ch_ptr;
  }
  else if ((ulong)((long)puVar4 - (long)puVar2) < len) {
    __n = (m->m_body).ch_len;
    if (__n + len + 8 <= uVar5) {
      uVar5 = ((uVar5 - __n) - len >> 1) + 7 & 0xfffffffffffffff8;
      memmove(puVar2 + uVar5,puVar4,__n);
      puVar4 = (m->m_body).ch_buf + uVar5;
      goto LAB_001130df;
    }
    goto LAB_001130c4;
  }
  puVar4 = puVar4 + -len;
LAB_001130df:
  (m->m_body).ch_ptr = puVar4;
  psVar1 = &(m->m_body).ch_len;
  *psVar1 = *psVar1 + len;
  if (data != (void *)0x0) {
    memcpy((m->m_body).ch_ptr,data,len);
  }
  return 0;
}

Assistant:

int
nni_msg_insert(nni_msg *m, const void *data, size_t len)
{
	return (nni_chunk_insert(&m->m_body, data, len));
}